

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O2

int __thiscall smf::Binasc::processAsciiWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  int iVar1;
  ostream *poVar2;
  char cVar3;
  char *pcVar4;
  
  pcVar4 = (word->_M_dataplus)._M_p;
  if (*pcVar4 == '+') {
    iVar1 = (int)word->_M_string_length;
    if (iVar1 < 3) {
      cVar3 = ' ';
      if (iVar1 == 2) {
        cVar3 = pcVar4[1];
      }
      std::operator<<(out,cVar3);
      return 1;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lineNum);
    poVar2 = std::operator<<(poVar2," at token: ");
    poVar2 = std::operator<<(poVar2,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar4 = "character byte word is too long -- specify only one character";
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error on line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lineNum);
    poVar2 = std::operator<<(poVar2," at token: ");
    poVar2 = std::operator<<(poVar2,(string *)word);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar4 = "character byte must start with \'+\' sign: ";
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int Binasc::processAsciiWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();
	uchar outputByte;

	if (word[0] != '+') {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "character byte must start with \'+\' sign: " << std::endl;
		return 0;
	}

	if (length > 2) {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "character byte word is too long -- specify only one character"
			  << std::endl;
		return 0;
	}

	if (length == 2) {
		outputByte = (uchar)word[1];
	} else {
		outputByte = ' ';
	}
	out << outputByte;
	return 1;
}